

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

bool __thiscall
duckdb::BinaryLambdaWrapper::
Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
          (BinaryLambdaWrapper *this,anon_class_16_2_9a274d3c fun,string_t left,string_t right,
          ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  pointer this_00;
  ValidityMask *pVVar2;
  long lVar3;
  undefined1 local_88 [8];
  ValidityMask *local_80;
  string local_78;
  string local_58;
  undefined8 local_38;
  long local_30;
  
  local_88 = left.value._8_8_;
  local_80 = mask;
  local_38 = fun.context;
  local_30 = left.value._0_8_;
  this_00 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
            ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                          *)this);
  lVar3 = left.value._0_8_;
  if ((uint)fun.context < 0xd) {
    lVar3 = (long)&local_38 + 4;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,lVar3,((ulong)fun.context & 0xffffffff) + lVar3);
  pVVar2 = local_80;
  if (((ulong)local_88 & 0xffffffff) < 0xd) {
    pVVar2 = (ValidityMask *)(local_88 + 4);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,pVVar2,
             (undefined1 *)
             ((long)&(pVVar2->super_TemplatedValidityMask<unsigned_long>).validity_mask +
             ((ulong)local_88 & 0xffffffff)));
  bVar1 = CatalogSearchPath::SchemaInSearchPath
                    (this_00,(ClientContext *)fun.search_path,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}